

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void PickBestUV(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  VP8ModeScore *in_RSI;
  VP8EncIterator *in_RDI;
  VP8ModeScore rd_uv;
  int mode;
  VP8ModeScore rd_best;
  uint8_t *dst;
  uint8_t *dst0;
  uint8_t *tmp_dst;
  uint8_t *src;
  int lambda;
  VP8SegmentInfo *dqm;
  int kNumBlocks;
  long local_730;
  score_t local_728;
  ulong local_720;
  long local_718;
  long local_710;
  VP8ModeScore *in_stack_fffffffffffff918;
  VP8EncIterator *in_stack_fffffffffffff920;
  int in_stack_fffffffffffff9ec;
  uint8_t *in_stack_fffffffffffff9f0;
  VP8ModeScore *in_stack_fffffffffffff9f8;
  VP8EncIterator *in_stack_fffffffffffffa00;
  int16_t aiStack_4e8 [140];
  uint32_t local_3d0;
  int8_t local_3cc [3];
  int8_t local_3c8 [12];
  int local_3bc;
  VP8ModeScore local_3b8;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  uint8_t *local_30;
  int local_24;
  VP8SegmentInfo *local_20;
  undefined4 local_14;
  VP8ModeScore *local_10;
  VP8EncIterator *local_8;
  
  local_14 = 8;
  local_20 = in_RDI->enc->dqm + (*(byte *)in_RDI->mb >> 5 & 3);
  local_24 = local_20->lambda_uv;
  local_30 = in_RDI->yuv_in + 0x10;
  local_38 = in_RDI->yuv_out2 + 0x10;
  local_48 = in_RDI->yuv_out + 0x10;
  in_RSI->mode_uv = -1;
  local_40 = local_48;
  local_10 = in_RSI;
  local_8 = in_RDI;
  InitScore(&local_3b8);
  for (local_3bc = 0; local_3bc < 4; local_3bc = local_3bc + 1) {
    local_3d0 = ReconstructUV(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                              in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
    iVar1 = (*VP8SSE16x8)(local_30,local_38);
    local_730 = (long)iVar1;
    local_728 = 0;
    local_720 = (ulong)VP8FixedCostsUV[local_3bc];
    iVar1 = VP8GetCostUV(in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    local_718 = (long)iVar1;
    if (0 < local_3bc) {
      iVar1 = IsFlat_C(aiStack_4e8,8,2);
      if (iVar1 != 0) {
        local_718 = local_718 + 0x460;
      }
    }
    SetRDScore(local_24,(VP8ModeScore *)&local_730);
    if ((local_3bc == 0) || (local_710 < local_3b8.score)) {
      CopyScore(&local_3b8,(VP8ModeScore *)&local_730);
      local_10->mode_uv = local_3bc;
      memcpy(local_10->uv_levels,aiStack_4e8,0x100);
      if (local_8->top_derr != (DError *)0x0) {
        *(undefined4 *)local_10->derr = _local_3cc;
        *(undefined2 *)(local_10->derr[1] + 1) = local_3c8._0_2_;
      }
      SwapPtr(&local_48,&local_38);
    }
  }
  VP8SetIntraUVMode(local_8,local_10->mode_uv);
  AddScore(local_10,&local_3b8);
  if (local_48 != local_40) {
    (*VP8Copy16x8)(local_48,local_40);
  }
  if (local_8->top_derr != (DError *)0x0) {
    StoreDiffusionErrors(local_8,local_10);
  }
  return;
}

Assistant:

static void PickBestUV(VP8EncIterator* WEBP_RESTRICT const it,
                       VP8ModeScore* WEBP_RESTRICT const rd) {
  const int kNumBlocks = 8;
  const VP8SegmentInfo* const dqm = &it->enc->dqm[it->mb->segment];
  const int lambda = dqm->lambda_uv;
  const uint8_t* const src = it->yuv_in + U_OFF_ENC;
  uint8_t* tmp_dst = it->yuv_out2 + U_OFF_ENC;  // scratch buffer
  uint8_t* dst0 = it->yuv_out + U_OFF_ENC;
  uint8_t* dst = dst0;
  VP8ModeScore rd_best;
  int mode;

  rd->mode_uv = -1;
  InitScore(&rd_best);
  for (mode = 0; mode < NUM_PRED_MODES; ++mode) {
    VP8ModeScore rd_uv;

    // Reconstruct
    rd_uv.nz = ReconstructUV(it, &rd_uv, tmp_dst, mode);

    // Compute RD-score
    rd_uv.D  = VP8SSE16x8(src, tmp_dst);
    rd_uv.SD = 0;    // not calling TDisto here: it tends to flatten areas.
    rd_uv.H  = VP8FixedCostsUV[mode];
    rd_uv.R  = VP8GetCostUV(it, &rd_uv);
    if (mode > 0 && IsFlat(rd_uv.uv_levels[0], kNumBlocks, FLATNESS_LIMIT_UV)) {
      rd_uv.R += FLATNESS_PENALTY * kNumBlocks;
    }

    SetRDScore(lambda, &rd_uv);
    if (mode == 0 || rd_uv.score < rd_best.score) {
      CopyScore(&rd_best, &rd_uv);
      rd->mode_uv = mode;
      memcpy(rd->uv_levels, rd_uv.uv_levels, sizeof(rd->uv_levels));
      if (it->top_derr != NULL) {
        memcpy(rd->derr, rd_uv.derr, sizeof(rd_uv.derr));
      }
      SwapPtr(&dst, &tmp_dst);
    }
  }
  VP8SetIntraUVMode(it, rd->mode_uv);
  AddScore(rd, &rd_best);
  if (dst != dst0) {   // copy 16x8 block if needed
    VP8Copy16x8(dst, dst0);
  }
  if (it->top_derr != NULL) {  // store diffusion errors for next block
    StoreDiffusionErrors(it, rd);
  }
}